

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t axbVecMAXPY(axbVec_s *y,size_t num_vecs,axbScalar_s **alpha,axbVec_s **x)

{
  axbOpDescriptor_t *paVar1;
  long lVar2;
  axbStatus_t aVar3;
  ulong uVar4;
  bool bVar5;
  
  if (y->init == 0x1d232) {
    bVar5 = num_vecs != 0;
    if (bVar5) {
      if ((*x)->init == 0x1d232) {
        uVar4 = 0;
        do {
          if (num_vecs - 1 == uVar4) goto LAB_00108272;
          lVar2 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while (x[lVar2]->init == 0x1d232);
        bVar5 = uVar4 < num_vecs;
      }
      fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
      if (bVar5) {
        return 0x1d232;
      }
    }
LAB_00108272:
    paVar1 = y->opBackend->op_table;
    (*paVar1[0x14].func)(y,num_vecs,alpha,x,paVar1[0x14].func_data);
    aVar3 = 0;
  }
  else {
    axbVecMAXPY_cold_1();
    aVar3 = 0x1d232;
  }
  return aVar3;
}

Assistant:

axbStatus_t axbVecMAXPY(struct axbVec_s *y, size_t num_vecs, const struct axbScalar_s * const *alpha, const struct axbVec_s * const *x)
{
  AXB_VECTOR_INIT_CHECK(y);
  for (size_t i=0; i<num_vecs; ++i) AXB_VECTOR_INIT_CHECK(x[i]);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_MAXPY];
  axbStatus_t (*op)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*) = (axbStatus_t (*)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*)) op_desc.func;
  op(y, num_vecs, alpha, x, op_desc.func_data);
  return 0;
}